

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O2

void UnitTest::CheckEqual<double,double>
               (TestResults *results,double *expected,double *actual,TestDetails *details)

{
  ostream *poVar1;
  char *failure;
  MemoryOutStream stream;
  MemoryOutStream local_1c0;
  
  if ((*expected != *actual) || (NAN(*expected) || NAN(*actual))) {
    MemoryOutStream::MemoryOutStream(&local_1c0);
    std::operator<<((ostream *)&local_1c0,"Expected ");
    poVar1 = std::ostream::_M_insert<double>(*expected);
    std::operator<<(poVar1," but was ");
    std::ostream::_M_insert<double>(*actual);
    failure = MemoryOutStream::GetText(&local_1c0);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream(&local_1c0);
  }
  return;
}

Assistant:

void CheckEqual(TestResults& results, Expected const& expected, Actual const& actual, TestDetails const& details)
{
    if (!(expected == actual))
    {
        UnitTest::MemoryOutStream stream;
        stream << "Expected " << expected << " but was " << actual;

        results.OnTestFailure(details, stream.GetText());
    }
}